

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plt-elf.c
# Opt level: O2

size_t get_offsets(plt_ctx ctx,plt_lib lib,char *name,plt_offset **offsets)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  Elf64_Addr EVar4;
  int iVar5;
  void *pvVar6;
  void *pvVar7;
  Elf64_Rel *pEVar8;
  ElfWord EVar9;
  ElfWord EVar10;
  void *pvVar11;
  long lVar12;
  ElfSWord tag;
  Elf64_Xword *pEVar13;
  ulong uVar14;
  long lVar15;
  ElfSWord EStack_a0;
  Elf64_Rel *local_90;
  rel_info info [2];
  
  pvVar6 = lib_dt_lookup((plt_lib)ctx,6);
  pvVar7 = lib_dt_lookup((plt_lib)ctx,5);
  pEVar8 = (Elf64_Rel *)lib_dt_lookup((plt_lib)ctx,0x17);
  EVar9 = lib_dt_lookup_val((plt_lib)ctx,2);
  local_90 = (Elf64_Rel *)lib_dt_lookup((plt_lib)ctx,7);
  if (local_90 == (Elf64_Rel *)0x0) {
    local_90 = (Elf64_Rel *)lib_dt_lookup((plt_lib)ctx,0x11);
    if (local_90 == (Elf64_Rel *)0x0) {
      return 0;
    }
    tag = 0x13;
    EStack_a0 = 0x12;
  }
  else {
    tag = 9;
    EStack_a0 = 8;
  }
  EVar10 = lib_dt_lookup_val((plt_lib)ctx,EStack_a0);
  info[0].entry_sz = lib_dt_lookup_val((plt_lib)ctx,tag);
  if ((pvVar7 == (void *)0x0 || pvVar6 == (void *)0x0) ||
     (info[0].entry_sz == 0 || EVar10 == 0 && EVar9 == 0)) {
    return 0;
  }
  lVar1 = *(long *)ctx;
  if (name != (char *)0x0) {
    name[0] = '\0';
    name[1] = '\0';
    name[2] = '\0';
    name[3] = '\0';
    name[4] = '\0';
    name[5] = '\0';
    name[6] = '\0';
    name[7] = '\0';
  }
  info[0].tab = local_90;
  info[0].size = EVar10;
  info[1].tab = pEVar8;
  info[1].size = EVar9;
  info[1].entry_sz = info[0].entry_sz;
  local_90 = (Elf64_Rel *)0x0;
  lVar12 = 0;
  do {
    if (lVar12 == 2) {
      return (size_t)local_90;
    }
    uVar2 = info[lVar12].size;
    uVar3 = info[lVar12].entry_sz;
    pEVar13 = &(info[lVar12].tab)->r_info;
    for (uVar14 = 0; uVar14 < uVar2 / uVar3; uVar14 = uVar14 + 1) {
      iVar5 = strcmp((char *)((ulong)*(uint *)((long)pvVar6 +
                                              (ulong)*(uint *)((long)pEVar13 + 4) * 0x18) +
                             (long)pvVar7),(char *)lib);
      if (iVar5 == 0) {
        EVar4 = ((Elf64_Rel *)(pEVar13 + -1))->r_offset;
        if (EVar4 != 0) {
          if (name != (char *)0x0) {
            lVar15 = (long)local_90 * 0x10;
            pvVar11 = mmk_realloc(*(void **)name,lVar15 + 0x10);
            *(void **)name = pvVar11;
            *(Elf64_Addr *)((long)pvVar11 + lVar15) = EVar4 + lVar1;
            *(undefined8 *)((long)pvVar11 + lVar15 + 8) = 0;
          }
          local_90 = (Elf64_Rel *)((long)local_90 + 1);
        }
        break;
      }
      pEVar13 = (Elf64_Xword *)((long)pEVar13 + uVar3);
    }
    lVar12 = lVar12 + 1;
  } while( true );
}

Assistant:

static size_t get_offsets(plt_ctx ctx, plt_lib lib, const char *name, plt_offset ** offsets)
{
    ElfW(Sym) *symtab   = (ElfW(Sym)*)  lib_dt_lookup(lib, DT_SYMTAB);
    const char *strtab  = (const char*) lib_dt_lookup(lib, DT_STRTAB);

    ElfW(Rel)   *jmprel = lib_dt_lookup(lib, DT_JMPREL);

    ElfWord jmprel_sz = lib_dt_lookup_val(lib, DT_PLTRELSZ);
    ElfWord relent_sz;
    ElfWord rel_sz;

    // For relocation sections try DT_RELA first, then DT_REL. We don't deal with
    // addends anyway.
    ElfW(Rel) *rel = lib_dt_lookup(lib, DT_RELA);
    if (!rel) {
        rel = lib_dt_lookup(lib, DT_REL);
        if (!rel)
            return 0;
        rel_sz = lib_dt_lookup_val(lib, DT_RELSZ);
        relent_sz = lib_dt_lookup_val(lib, DT_RELENT);
    } else {
        rel_sz = lib_dt_lookup_val(lib, DT_RELASZ);
        relent_sz = lib_dt_lookup_val(lib, DT_RELAENT);
    }

    if (!symtab || !strtab || !(rel || jmprel) || !(rel_sz || jmprel_sz) || !relent_sz)
        return 0;

    ElfW(Addr) base = (ElfW(Addr)) lib->l_addr;
#ifdef __FreeBSD__
    if (lib == ctx->r_map)
        base = 0;
#endif

    size_t n = 0;
    if (offsets) {
        *offsets = NULL;
    }

    struct rel_info info[] = {
        {
          .tab = rel,
          .size = rel_sz,
          .entry_sz = relent_sz,
        },
        {
          .tab = jmprel,
          .size = jmprel_sz,
          .entry_sz = relent_sz,
        }
    };

    for (size_t i = 0; i < sizeof(info) / sizeof(struct rel_info); ++i) {
        uintptr_t off = get_offset(&info[i], symtab, strtab, name);
        if (off) {
            if (offsets) {
                *offsets = mmk_realloc(*offsets, (n + 1) * sizeof(plt_offset));
                (*offsets)[n] = (plt_offset) { .offset = (plt_fn **)(base + off) };
            }
            ++n;
        }
    }

    return n;
}